

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_buffer.cpp
# Opt level: O2

int __thiscall libtorrent::aux::packet_buffer::remove(packet_buffer *this,char *__filename)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  _Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
  _Var4;
  bool bVar5;
  ulong uVar6;
  uint32_t uVar7;
  int iVar8;
  uint uVar9;
  uint32_t in_EDX;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  
  if ((*(int *)(__filename + 8) + *(uint32_t *)(__filename + 0x10) <= in_EDX) ||
     (bVar5 = compare_less_wrap(in_EDX,*(uint32_t *)(__filename + 0x10),0xffff), bVar5)) {
    (this->m_storage).
    super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
    ._M_t.
    super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
    .
    super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
         = (_Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
            )0x0;
    goto LAB_0021af56;
  }
  uVar11 = *(int *)(__filename + 8) - 1;
  uVar6 = (ulong)(uVar11 & in_EDX);
  lVar3 = *(long *)__filename;
  _Var4._M_head_impl =
       ((_Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
         *)(lVar3 + uVar6 * 8))->_M_head_impl;
  (this->m_storage).
  super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  ._M_t.
  super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  .
  super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
       = (_Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
          )_Var4._M_head_impl;
  *(undefined8 *)(lVar3 + uVar6 * 8) = 0;
  ::std::__uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::reset
            ((__uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
             (uVar6 * 8 + *(long *)__filename),(pointer)0x0);
  if (_Var4._M_head_impl ==
      (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)0x0) {
    uVar7 = *(uint32_t *)(__filename + 0x10);
    bVar5 = *(int *)(__filename + 0xc) == 0;
LAB_0021afad:
    if (!(bool)(uVar7 != in_EDX | bVar5)) {
      iVar8 = *(int *)(__filename + 8);
      iVar13 = iVar8 + in_EDX;
      uVar7 = in_EDX;
      do {
        bVar14 = iVar8 == 0;
        iVar8 = iVar8 + -1;
        uVar12 = iVar13 + 1;
        if (bVar14) break;
        uVar12 = uVar7 + 1;
        uVar7 = uVar12;
      } while (*(long *)(*(long *)__filename + (ulong)(uVar12 & uVar11) * 8) == 0);
      *(uint *)(__filename + 0x10) = uVar12 & 0xffff;
    }
  }
  else {
    piVar2 = (int *)(__filename + 0xc);
    *piVar2 = *piVar2 + -1;
    uVar7 = *(uint32_t *)(__filename + 0x10);
    if (*piVar2 != 0) {
      bVar5 = false;
      goto LAB_0021afad;
    }
    *(uint32_t *)(__filename + 0x14) = uVar7;
    bVar5 = true;
  }
  uVar12 = in_EDX + 1 & 0xffff;
  if (uVar12 == *(uint *)(__filename + 0x14) && !bVar5) {
    iVar8 = *(int *)(__filename + 8);
    uVar10 = uVar12 - iVar8;
    uVar12 = uVar12 + 1;
    do {
      bVar5 = iVar8 == 0;
      iVar8 = iVar8 + -1;
      uVar9 = uVar10;
      if (bVar5) break;
      uVar1 = uVar12 - 2;
      uVar12 = uVar12 - 1;
      uVar9 = uVar12;
    } while (*(long *)(*(long *)__filename + (ulong)(uVar1 & uVar11) * 8) == 0);
    *(uint *)(__filename + 0x14) = uVar9 & 0xffff;
  }
LAB_0021af56:
  return (int)this;
}

Assistant:

packet_ptr packet_buffer::remove(index_type idx)
	{
		INVARIANT_CHECK;
		// TODO: use compare_less_wrap for this comparison as well
		if (idx >= m_first + m_capacity)
			return packet_ptr();

		if (compare_less_wrap(idx, m_first, 0xffff))
			return packet_ptr();

		std::size_t const mask = m_capacity - 1;
		packet_ptr old_value = std::move(m_storage[idx & mask]);
		m_storage[idx & mask].reset();

		if (old_value)
		{
			--m_size;
			if (m_size == 0) m_last = m_first;
		}

		if (idx == m_first && m_size != 0)
		{
			++m_first;
			for (index_type i = 0; i < m_capacity; ++i, ++m_first)
				if (m_storage[m_first & mask]) break;
			m_first &= 0xffff;
		}

		if (((idx + 1) & 0xffff) == m_last && m_size != 0)
		{
			--m_last;
			for (index_type i = 0; i < m_capacity; ++i, --m_last)
				if (m_storage[m_last & mask]) break;
			++m_last;
			m_last &= 0xffff;
		}

		TORRENT_ASSERT_VAL(m_first <= 0xffff, m_first);
		return old_value;
	}